

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngframe.cpp
# Opt level: O0

void __thiscall
apngasm::APNGFrame::APNGFrame(APNGFrame *this,string *filePath,uint delayNum,uint delayDen)

{
  undefined1 auVar1 [16];
  uchar uVar2;
  int iVar3;
  uint uVar4;
  char *__filename;
  size_t sVar5;
  __jmp_buf_tag *__env;
  uchar *puVar6;
  ulong uVar7;
  uchar **ppuVar8;
  void *local_68;
  png_bytep trans_alpha;
  png_color_16p trans_color;
  png_colorp palette;
  int local_48;
  png_uint_32 i;
  png_uint_32 rowbytes;
  png_byte depth;
  png_infop info_ptr;
  png_structp png_ptr;
  uchar sig [8];
  FILE *f;
  uint delayDen_local;
  uint delayNum_local;
  string *filePath_local;
  APNGFrame *this_local;
  
  this->_pixels = (uchar *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_colorType = '\0';
  this->_paletteSize = 0;
  this->_transparencySize = 0;
  this->_delayNum = delayNum;
  this->_delayDen = delayDen;
  this->_rows = (uchar **)0x0;
  __filename = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(filePath);
  sig = (uchar  [8])fopen(__filename,"rb");
  if (sig != (uchar  [8])0x0) {
    sVar5 = fread(&png_ptr,1,8,(FILE *)sig);
    if ((sVar5 == 8) && (iVar3 = png_sig_cmp(&png_ptr,0,8), iVar3 == 0)) {
      info_ptr = (png_infop)png_create_read_struct("1.6.37",0,0);
      _rowbytes = png_create_info_struct(info_ptr);
      if ((info_ptr != (png_infop)0x0) && (_rowbytes != 0)) {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(info_ptr,longjmp,200);
        iVar3 = _setjmp(__env);
        if (iVar3 != 0) {
          png_destroy_read_struct(&info_ptr,&rowbytes,0);
          fclose((FILE *)sig);
          return;
        }
        png_init_io(info_ptr,sig);
        png_set_sig_bytes(info_ptr,8);
        png_read_info(info_ptr,_rowbytes);
        uVar4 = png_get_image_width(info_ptr,_rowbytes);
        this->_width = uVar4;
        uVar4 = png_get_image_height(info_ptr,_rowbytes);
        this->_height = uVar4;
        uVar2 = png_get_color_type(info_ptr,_rowbytes);
        this->_colorType = uVar2;
        i._3_1_ = png_get_bit_depth(info_ptr,_rowbytes);
        if (i._3_1_ < 8) {
          if (this->_colorType == '\x03') {
            png_set_packing(info_ptr);
          }
          else {
            png_set_expand(info_ptr);
          }
        }
        else if (8 < i._3_1_) {
          png_set_expand(info_ptr);
          png_set_strip_16(info_ptr);
        }
        png_set_interlace_handling(info_ptr);
        png_read_update_info(info_ptr,_rowbytes);
        uVar2 = png_get_color_type(info_ptr,_rowbytes);
        this->_colorType = uVar2;
        local_48 = png_get_rowbytes(info_ptr,_rowbytes);
        memset(this->_palette,0xff,0x300);
        memset(this->_transparency,0xff,0x100);
        iVar3 = png_get_PLTE(info_ptr,_rowbytes,&trans_color,&this->_paletteSize);
        if (iVar3 == 0) {
          this->_paletteSize = 0;
        }
        else {
          memcpy(this->_palette,trans_color,(long)(this->_paletteSize * 3));
        }
        iVar3 = png_get_tRNS(info_ptr,_rowbytes,&local_68,&this->_transparencySize,&trans_alpha);
        if (iVar3 == 0) {
          this->_transparencySize = 0;
        }
        else if (0 < this->_transparencySize) {
          if (this->_colorType == '\0') {
            this->_transparency[0] = '\0';
            this->_transparency[1] = (uchar)*(undefined2 *)(trans_alpha + 8);
            this->_transparencySize = 2;
          }
          else if (this->_colorType == '\x02') {
            this->_transparency[0] = '\0';
            this->_transparency[1] = (uchar)*(undefined2 *)(trans_alpha + 2);
            this->_transparency[2] = '\0';
            this->_transparency[3] = (uchar)*(undefined2 *)(trans_alpha + 4);
            this->_transparency[4] = '\0';
            this->_transparency[5] = (uchar)*(undefined2 *)(trans_alpha + 6);
            this->_transparencySize = 6;
          }
          else if (this->_colorType == '\x03') {
            memcpy(this->_transparency,local_68,(long)this->_transparencySize);
          }
          else {
            this->_transparencySize = 0;
          }
        }
        puVar6 = (uchar *)operator_new__((ulong)(this->_height * local_48));
        this->_pixels = puVar6;
        auVar1 = ZEXT416(this->_height) * (undefined1  [16])0x8 * ZEXT816(8);
        uVar7 = auVar1._0_8_;
        if (auVar1._8_8_ != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        ppuVar8 = (uchar **)operator_new__(uVar7);
        this->_rows = ppuVar8;
        for (palette._4_4_ = 0; palette._4_4_ < this->_height; palette._4_4_ = palette._4_4_ + 1) {
          this->_rows[palette._4_4_] = this->_pixels + palette._4_4_ * local_48;
        }
        png_read_image(info_ptr,this->_rows);
        png_read_end(info_ptr,0);
      }
      png_destroy_read_struct(&info_ptr,&rowbytes,0);
    }
    fclose((FILE *)sig);
  }
  return;
}

Assistant:

APNGFrame::APNGFrame(const std::string &filePath, unsigned delayNum,
                     unsigned delayDen)
    : _pixels(NULL), _width(0), _height(0), _colorType(0), _paletteSize(0),
      _transparencySize(0), _delayNum(delayNum), _delayDen(delayDen),
      _rows(NULL) {
  // TODO save extracted info to self
  FILE *f;
  if ((f = fopen(filePath.c_str(), "rb")) != 0) {
    unsigned char sig[8];

    if (fread(sig, 1, 8, f) == 8 && png_sig_cmp(sig, 0, 8) == 0) {
      png_structp png_ptr =
          png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
      png_infop info_ptr = png_create_info_struct(png_ptr);
      if (png_ptr && info_ptr) {
        png_byte depth;
        png_uint_32 rowbytes, i;
        png_colorp palette;
        png_color_16p trans_color;
        png_bytep trans_alpha;

        if (setjmp(png_jmpbuf(png_ptr))) {
          png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
          fclose(f);
          return;
        }

        png_init_io(png_ptr, f);
        png_set_sig_bytes(png_ptr, 8);
        png_read_info(png_ptr, info_ptr);
        _width = png_get_image_width(png_ptr, info_ptr);
        _height = png_get_image_height(png_ptr, info_ptr);
        _colorType = png_get_color_type(png_ptr, info_ptr);
        depth = png_get_bit_depth(png_ptr, info_ptr);
        if (depth < 8) {
          if (_colorType == PNG_COLOR_TYPE_PALETTE)
            png_set_packing(png_ptr);
          else
            png_set_expand(png_ptr);
        } else if (depth > 8) {
          png_set_expand(png_ptr);
          png_set_strip_16(png_ptr);
        }
        (void)png_set_interlace_handling(png_ptr);
        png_read_update_info(png_ptr, info_ptr);
        _colorType = png_get_color_type(png_ptr, info_ptr);
        rowbytes = png_get_rowbytes(png_ptr, info_ptr);
        memset(_palette, 255, sizeof(_palette));
        memset(_transparency, 255, sizeof(_transparency));

        if (png_get_PLTE(png_ptr, info_ptr, &palette, &_paletteSize))
          memcpy(_palette, palette, _paletteSize * 3);
        else
          _paletteSize = 0;

        if (png_get_tRNS(png_ptr, info_ptr, &trans_alpha, &_transparencySize,
                         &trans_color)) {
          if (_transparencySize > 0) {
            if (_colorType == PNG_COLOR_TYPE_GRAY) {
              _transparency[0] = 0;
              _transparency[1] = trans_color->gray & 0xFF;
              _transparencySize = 2;
            } else if (_colorType == PNG_COLOR_TYPE_RGB) {
              _transparency[0] = 0;
              _transparency[1] = trans_color->red & 0xFF;
              _transparency[2] = 0;
              _transparency[3] = trans_color->green & 0xFF;
              _transparency[4] = 0;
              _transparency[5] = trans_color->blue & 0xFF;
              _transparencySize = 6;
            } else if (_colorType == PNG_COLOR_TYPE_PALETTE)
              memcpy(_transparency, trans_alpha, _transparencySize);
            else
              _transparencySize = 0;
          }
        } else
          _transparencySize = 0;

        _pixels = new unsigned char[_height * rowbytes];
        _rows = new png_bytep[_height * sizeof(png_bytep)];

        for (i = 0; i < _height; ++i)
          _rows[i] = _pixels + i * rowbytes;

        png_read_image(png_ptr, _rows);
        png_read_end(png_ptr, NULL);
      }
      png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    }
    fclose(f);
  }
}